

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O0

void Acb_CollectIntNodes_rec(Gia_Man_t *p,Gia_Obj_t *pObj,Vec_Int_t *vNodes)

{
  int iVar1;
  Gia_Obj_t *pGVar2;
  Vec_Int_t *vNodes_local;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  iVar1 = Gia_ObjIsTravIdCurrent(p,pObj);
  if (iVar1 == 0) {
    Gia_ObjSetTravIdCurrent(p,pObj);
    iVar1 = Gia_ObjIsAnd(pObj);
    if (iVar1 == 0) {
      __assert_fail("Gia_ObjIsAnd(pObj)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbFunc.c"
                    ,0x712,"void Acb_CollectIntNodes_rec(Gia_Man_t *, Gia_Obj_t *, Vec_Int_t *)");
    }
    pGVar2 = Gia_ObjFanin0(pObj);
    Acb_CollectIntNodes_rec(p,pGVar2,vNodes);
    pGVar2 = Gia_ObjFanin1(pObj);
    Acb_CollectIntNodes_rec(p,pGVar2,vNodes);
    iVar1 = Gia_ObjId(p,pObj);
    Vec_IntPush(vNodes,iVar1);
  }
  return;
}

Assistant:

void Acb_CollectIntNodes_rec( Gia_Man_t * p, Gia_Obj_t * pObj, Vec_Int_t * vNodes )
{
    if ( Gia_ObjIsTravIdCurrent(p, pObj) )
        return;
    Gia_ObjSetTravIdCurrent(p, pObj);
    assert( Gia_ObjIsAnd(pObj) );
    Acb_CollectIntNodes_rec( p, Gia_ObjFanin0(pObj), vNodes );
    Acb_CollectIntNodes_rec( p, Gia_ObjFanin1(pObj), vNodes );
    Vec_IntPush( vNodes, Gia_ObjId(p, pObj) );
}